

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalPhraseStart(Fts3Cursor *pCsr,int bOptOk,Fts3Phrase *p)

{
  uint uVar1;
  int iVar2;
  Fts3Table *p_00;
  Fts3MultiSegReader *pCsr_00;
  char *zTerm;
  Fts3SegReader **ppFVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  code *xCmp;
  int iToken;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  Fts3PhraseToken *pTok;
  long in_FS_OFFSET;
  Fts3Table *pTab;
  int nThis;
  char *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_00 = (Fts3Table *)(pCsr->base).pVtab;
  if (((bOptOk != 0) && (pCsr->bDesc == p_00->bDescIdx)) && (0xfffffffb < p->nToken - 5U)) {
    uVar1 = p->nToken;
    uVar5 = 0;
    uVar4 = uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    if (0 < (int)uVar1) {
      lVar8 = 0;
      do {
        if ((*(int *)((long)&p->aToken[0].bFirst + lVar8) != 0) ||
           ((lVar11 = *(long *)((long)&p->aToken[0].pSegcsr + lVar8), lVar11 != 0 &&
            (uVar5 = 1, *(int *)(lVar11 + 0x34) == 0)))) goto LAB_001cc788;
        lVar8 = lVar8 + 0x28;
      } while ((ulong)uVar4 * 0x28 != lVar8);
      if (uVar5 != 0) {
        iVar7 = -1;
        if (p->iColumn < p_00->nColumn) {
          iVar7 = p->iColumn;
        }
        iVar12 = 1;
        iVar2 = 1;
        if (p->nToken < 1) {
LAB_001cc806:
          iVar12 = iVar2;
          iVar6 = 0;
        }
        else {
          lVar8 = 0;
          do {
            pCsr_00 = p->aToken[lVar8].pSegcsr;
            if (pCsr_00 != (Fts3MultiSegReader *)0x0) {
              zTerm = p->aToken[lVar8].z;
              iVar2 = p->aToken[lVar8].n;
              uVar1 = pCsr_00->nSegment;
              xCmp = fts3SegReaderDoclistCmpRev;
              if (p_00->bDescIdx == '\0') {
                xCmp = fts3SegReaderDoclistCmp;
              }
              iVar6 = fts3SegReaderStart(p_00,pCsr_00,zTerm,iVar2);
              if (iVar6 != 0) break;
              if ((int)uVar1 < 1) {
                pCsr_00->nAdvance = 0;
                lVar11 = 0;
              }
              else {
                ppFVar3 = pCsr_00->apSegment;
                uVar9 = 0;
                do {
                  uVar10 = uVar9;
                  if ((ppFVar3[uVar9]->aNode == (char *)0x0) ||
                     (iVar6 = fts3SegReaderTermCmp(ppFVar3[uVar9],zTerm,iVar2), iVar6 != 0)) break;
                  uVar9 = uVar9 + 1;
                  uVar10 = (ulong)uVar1;
                } while (uVar1 != uVar9);
                pCsr_00->nAdvance = (int)uVar10;
                lVar11 = 0;
                if (0 < (int)uVar10) {
                  do {
                    iVar6 = fts3SegReaderFirstDocid
                                      ((Fts3Table *)(ulong)p_00->bDescIdx,pCsr_00->apSegment[lVar11]
                                      );
                    if (iVar6 != 0) goto LAB_001cc808;
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < pCsr_00->nAdvance);
                }
              }
              fts3SegReaderSort(pCsr_00->apSegment,(int)lVar11,(int)lVar11,xCmp);
              pCsr_00->iColFilter = iVar7;
            }
            lVar8 = lVar8 + 1;
            iVar6 = 0;
          } while (lVar8 < p->nToken);
        }
        goto LAB_001cc808;
      }
    }
  }
LAB_001cc788:
  pTok = p->aToken;
  lVar8 = 0;
  iVar12 = 0;
  do {
    if (p->nToken <= lVar8) {
      iVar2 = 0;
      goto LAB_001cc806;
    }
    iVar6 = 0;
    if (pTok->pSegcsr != (Fts3MultiSegReader *)0x0) {
      local_3c = 0;
      local_48 = (char *)0x0;
      iVar6 = fts3TermSelect(p_00,pTok,p->iColumn,&local_3c,&local_48);
      if (iVar6 == 0) {
        iVar6 = fts3EvalPhraseMergeToken(p_00,p,(int)lVar8,local_48,local_3c);
      }
    }
    lVar8 = lVar8 + 1;
    pTok = pTok + 1;
  } while (iVar6 == 0);
LAB_001cc808:
  p->bIncr = iVar12;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fts3EvalPhraseStart(Fts3Cursor *pCsr, int bOptOk, Fts3Phrase *p){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;             /* Error code */
  int i;

  /* Determine if doclists may be loaded from disk incrementally. This is
  ** possible if the bOptOk argument is true, the FTS doclists will be
  ** scanned in forward order, and the phrase consists of
  ** MAX_INCR_PHRASE_TOKENS or fewer tokens, none of which are are "^first"
  ** tokens or prefix tokens that cannot use a prefix-index.  */
  int bHaveIncr = 0;
  int bIncrOk = (bOptOk
   && pCsr->bDesc==pTab->bDescIdx
   && p->nToken<=MAX_INCR_PHRASE_TOKENS && p->nToken>0
#if defined(SQLITE_DEBUG) || defined(SQLITE_TEST)
   && pTab->bNoIncrDoclist==0
#endif
  );
  for(i=0; bIncrOk==1 && i<p->nToken; i++){
    Fts3PhraseToken *pToken = &p->aToken[i];
    if( pToken->bFirst || (pToken->pSegcsr!=0 && !pToken->pSegcsr->bLookup) ){
      bIncrOk = 0;
    }
    if( pToken->pSegcsr ) bHaveIncr = 1;
  }

  if( bIncrOk && bHaveIncr ){
    /* Use the incremental approach. */
    int iCol = (p->iColumn >= pTab->nColumn ? -1 : p->iColumn);
    for(i=0; rc==SQLITE_OK && i<p->nToken; i++){
      Fts3PhraseToken *pToken = &p->aToken[i];
      Fts3MultiSegReader *pSegcsr = pToken->pSegcsr;
      if( pSegcsr ){
        rc = sqlite3Fts3MsrIncrStart(pTab, pSegcsr, iCol, pToken->z, pToken->n);
      }
    }
    p->bIncr = 1;
  }else{
    /* Load the full doclist for the phrase into memory. */
    rc = fts3EvalPhraseLoad(pCsr, p);
    p->bIncr = 0;
  }

  assert( rc!=SQLITE_OK || p->nToken<1 || p->aToken[0].pSegcsr==0 || p->bIncr );
  return rc;
}